

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::RethrowRecordedException
          (ScriptContext *this,HostWrapperCreateFuncType hostWrapperCreateFunc)

{
  JavascriptExceptionObject *this_00;
  ScriptContext *pSVar1;
  HostWrapperCreateFuncType local_40;
  JavascriptExceptionObject *exceptionObject;
  HostWrapperCreateFuncType p_Stack_18;
  bool considerPassingToDebugger;
  HostWrapperCreateFuncType hostWrapperCreateFunc_local;
  ScriptContext *this_local;
  
  exceptionObject._7_1_ = 0;
  p_Stack_18 = hostWrapperCreateFunc;
  hostWrapperCreateFunc_local = (HostWrapperCreateFuncType)this;
  this_00 = GetAndClearRecordedException(this,(bool *)((long)&exceptionObject + 7));
  if (p_Stack_18 != (HostWrapperCreateFuncType)0x0) {
    pSVar1 = JavascriptExceptionObject::GetScriptContext(this_00);
    if (pSVar1 == this) {
      local_40 = (HostWrapperCreateFuncType)0x0;
    }
    else {
      local_40 = p_Stack_18;
    }
    JavascriptExceptionObject::SetHostWrapperCreateFunc(this_00,local_40);
  }
  JavascriptExceptionOperators::RethrowExceptionObject
            (this_00,this,(bool)(exceptionObject._7_1_ & 1));
}

Assistant:

void ScriptContext::RethrowRecordedException(JavascriptExceptionObject::HostWrapperCreateFuncType hostWrapperCreateFunc)
    {
        bool considerPassingToDebugger = false;
        JavascriptExceptionObject * exceptionObject = this->GetAndClearRecordedException(&considerPassingToDebugger);
        if (hostWrapperCreateFunc)
        {
            exceptionObject->SetHostWrapperCreateFunc(exceptionObject->GetScriptContext() != this ? hostWrapperCreateFunc : nullptr);
        }
        JavascriptExceptionOperators::RethrowExceptionObject(exceptionObject, this, considerPassingToDebugger);
    }